

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  pointer pcVar3;
  pointer pcVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  ostream *poVar8;
  undefined8 uVar9;
  char *__function;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  double t_cpu;
  double t_gpu;
  vector<int,_std::allocator<int>_> qubits;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> psi;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> circuit;
  vector<double,_std::allocator<double>_> T_gpu;
  vector<double,_std::allocator<double>_> T_cpu;
  uint local_144;
  double local_140;
  allocator_type local_131;
  double local_130;
  int *local_128;
  iterator iStack_120;
  int *local_118;
  pointer local_108;
  pointer pcStack_100;
  pointer local_f8;
  undefined1 local_e8 [24];
  vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  local_d0;
  void *local_b8;
  iterator iStack_b0;
  double *local_a8;
  void *local_98;
  iterator iStack_90;
  double *local_88;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_78;
  long local_60;
  long local_58;
  int local_4c;
  value_type local_48;
  
  local_4c = 100;
  if (1 < argc) {
    local_4c = (int)*argv[1];
  }
  uVar11 = 10;
  if (argc < 3) {
LAB_001056ef:
    lVar13 = 0x14;
    if (3 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e8,argv[3],(allocator<char> *)&local_78);
      uVar9 = local_e8._0_8_;
      piVar6 = __errno_location();
      iVar12 = *piVar6;
      *piVar6 = 0;
      lVar13 = strtol((char *)uVar9,(char **)&local_108,10);
      if (local_108 == (pointer)uVar9) goto LAB_00106440;
      if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar12;
        }
        if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
        }
        goto LAB_0010579a;
      }
      goto LAB_0010644c;
    }
LAB_0010579a:
    local_58 = 2;
    local_60 = lVar13;
    if (4 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e8,argv[4],(allocator<char> *)&local_78);
      uVar9 = local_e8._0_8_;
      piVar6 = __errno_location();
      iVar12 = *piVar6;
      *piVar6 = 0;
      lVar7 = strtol((char *)uVar9,(char **)&local_108,10);
      lVar13 = local_60;
      if (local_108 == (pointer)uVar9) goto LAB_00106458;
      local_58 = lVar7;
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar12;
        }
        if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
        }
        goto LAB_00105860;
      }
      goto LAB_00106464;
    }
LAB_00105860:
    bVar15 = true;
    if (argc < 6) {
LAB_00105913:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nb qubits = ",0xc);
      uVar10 = (uint)uVar11;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      lVar7 = local_58;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      iVar12 = (int)lVar13;
      std::ostream::operator<<((ostream *)poVar8,iVar12);
      local_144 = uVar10;
      if (local_4c == 100) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", T = std::complex<double>",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        local_118 = (int *)0x0;
        local_128 = (int *)0x0;
        iStack_120._M_current = (int *)0x0;
        local_88 = (double *)0x0;
        local_98 = (void *)0x0;
        iStack_90._M_current = (double *)0x0;
        local_a8 = (double *)0x0;
        local_b8 = (void *)0x0;
        iStack_b0._M_current = (double *)0x0;
        if ((int)uVar10 <= iVar12) {
          do {
            local_e8[8] = false;
            local_e8._0_8_ = &PTR_nbQubits_001231f0;
            uVar10 = (uint)uVar11;
            local_e8._16_4_ = 0;
            local_d0.
            super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d0.
            super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d0.
            super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_e8._12_4_ = uVar10;
            if ((int)uVar10 < 1) {
              __function = 
              "qclab::QCircuit<std::complex<double>>::QCircuit(const int) [T = std::complex<double>, G = qclab::QObject<std::complex<double>>]"
              ;
              goto LAB_0010641e;
            }
            trotter<std::complex<double>>
                      ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                       local_e8);
            local_140 = 9999.0;
            local_130 = 9999.0;
            local_108 = (pointer)0x0;
            pcStack_100 = (pointer)0x0;
            local_f8 = (pointer)0x0;
            if (bVar15) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CPU(",4);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              uVar14 = 3;
              uVar10 = 0;
              do {
                local_48._M_value._0_8_ = 0;
                local_48._M_value._8_8_ = 0;
                std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                          (&local_78,1L << ((byte)uVar11 & 0x3f),&local_48,
                           (allocator_type *)&local_131);
                pcVar4 = local_f8;
                pcVar3 = local_108;
                local_108 = local_78.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                pcStack_100 = local_78.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                local_f8 = local_78.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_78.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_78.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_78.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (pcVar3 != (pointer)0x0) {
                  operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
                }
                if (local_78.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.
                                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.
                                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                *(undefined **)local_108->_M_value = (undefined *)0x3ff0000000000000;
                *(undefined **)((long)local_108->_M_value + 8) = (undefined *)0x0;
                lVar13 = std::chrono::_V2::system_clock::now();
                (**(_func_int **)(local_e8._0_8_ + 0x40))
                          (local_e8,0x4e,(ulong)(uint)local_e8._12_4_,&local_108,0);
                lVar7 = std::chrono::_V2::system_clock::now();
                dVar2 = (double)(lVar7 - lVar13) / 1000000000.0;
                if (dVar2 < local_140) {
                  local_140 = dVar2;
                }
                uVar5 = uVar14;
                if (((uVar10 == 2) && (uVar5 = 100, 0.1 <= local_140)) &&
                   (uVar5 = uVar14, local_140 < 1.0)) {
                  uVar5 = 10;
                }
                uVar14 = uVar5;
                uVar5 = uVar10 + 1;
                if ((uVar10 < 3 || uVar5 == uVar14) &&
                   (printf("  * it%4i:%12.6fs",(ulong)uVar5), uVar5 != uVar14)) {
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                  std::ostream::put('\b');
                  std::ostream::flush();
                }
                uVar10 = uVar5;
              } while ((int)uVar5 < (int)uVar14);
              printf("  -->  min t_cpu = %.6fs\n",SUB84(local_140,0));
              lVar7 = local_58;
              lVar13 = local_60;
            }
            if ((local_140 == 9999.0) && (!NAN(local_140))) {
              local_140 = 0.0;
            }
            if ((local_130 == 9999.0) && (!NAN(local_130))) {
              local_130 = 0.0;
            }
            if (local_108 != (pointer)0x0) {
              operator_delete(local_108,(long)local_f8 - (long)local_108);
            }
            local_e8._0_8_ = &PTR_nbQubits_001231f0;
            std::
            vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ::~vector(&local_d0);
            if (iStack_120._M_current == local_118) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_128,iStack_120,(int *)&local_144)
              ;
            }
            else {
              *iStack_120._M_current = local_144;
              iStack_120._M_current = iStack_120._M_current + 1;
            }
            if (iStack_90._M_current == local_88) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_98,iStack_90,&local_140);
            }
            else {
              *iStack_90._M_current = local_140;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
            if (iStack_b0._M_current == local_a8) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_b8,iStack_b0,&local_130);
            }
            else {
              *iStack_b0._M_current = local_130;
              iStack_b0._M_current = iStack_b0._M_current + 1;
            }
            local_144 = local_144 + (int)lVar7;
            uVar11 = (ulong)local_144;
          } while ((int)local_144 <= (int)lVar13);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        if (iStack_120._M_current != local_128) {
          uVar11 = 0;
          do {
            dVar2 = *(double *)((long)local_98 + uVar11 * 8);
            dVar1 = *(double *)((long)local_b8 + uVar11 * 8);
            printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",SUB84(dVar2,0),dVar1,dVar2 / dVar1,
                   (ulong)(uint)local_128[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 2));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
      }
      else {
        if (local_4c != 0x73) {
          return -100;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", T = std::complex<float>",0x19);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        local_118 = (int *)0x0;
        local_128 = (int *)0x0;
        iStack_120._M_current = (int *)0x0;
        local_88 = (double *)0x0;
        local_98 = (void *)0x0;
        iStack_90._M_current = (double *)0x0;
        local_a8 = (double *)0x0;
        local_b8 = (void *)0x0;
        iStack_b0._M_current = (double *)0x0;
        if ((int)uVar10 <= iVar12) {
          do {
            local_e8[8] = false;
            local_e8._0_8_ = &PTR_nbQubits_00122bc0;
            uVar10 = (uint)uVar11;
            local_e8._16_4_ = 0;
            local_d0.
            super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d0.
            super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d0.
            super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_e8._12_4_ = uVar10;
            if ((int)uVar10 < 1) {
              __function = 
              "qclab::QCircuit<std::complex<float>>::QCircuit(const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
              ;
LAB_0010641e:
              local_d0.
              super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_d0.
              super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d0.
              super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8._16_4_ = 0;
              local_e8[8] = false;
              __assert_fail("nbQubits > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/QCircuit.hpp"
                            ,0x34,__function);
            }
            trotter<std::complex<float>>
                      ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)
                       local_e8);
            local_140 = 9999.0;
            local_130 = 9999.0;
            local_108 = (pointer)0x0;
            pcStack_100 = (pointer)0x0;
            local_f8 = (pointer)0x0;
            if (bVar15) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CPU(",4);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              uVar14 = 3;
              uVar10 = 0;
              do {
                local_48._M_value._0_8_ = 0;
                std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
                          ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                           &local_78,1L << ((byte)uVar11 & 0x3f),(value_type *)&local_48,&local_131)
                ;
                pcVar4 = local_f8;
                pcVar3 = local_108;
                local_108 = local_78.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                pcStack_100 = local_78.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                local_f8 = local_78.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_78.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_78.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_78.
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (pcVar3 != (pointer)0x0) {
                  operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
                }
                if (local_78.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.
                                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.
                                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                *(undefined **)local_108->_M_value = (undefined *)0x3f800000;
                lVar13 = std::chrono::_V2::system_clock::now();
                (**(_func_int **)(local_e8._0_8_ + 0x40))
                          (local_e8,0x4e,(ulong)(uint)local_e8._12_4_,&local_108,0);
                lVar7 = std::chrono::_V2::system_clock::now();
                dVar2 = (double)(lVar7 - lVar13) / 1000000000.0;
                if (dVar2 < local_140) {
                  local_140 = dVar2;
                }
                uVar5 = uVar14;
                if (((uVar10 == 2) && (uVar5 = 100, 0.1 <= local_140)) &&
                   (uVar5 = uVar14, local_140 < 1.0)) {
                  uVar5 = 10;
                }
                uVar14 = uVar5;
                uVar5 = uVar10 + 1;
                if ((uVar10 < 3 || uVar5 == uVar14) &&
                   (printf("  * it%4i:%12.6fs",(ulong)uVar5), uVar5 != uVar14)) {
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
                  std::ostream::put('\b');
                  std::ostream::flush();
                }
                uVar10 = uVar5;
              } while ((int)uVar5 < (int)uVar14);
              printf("  -->  min t_cpu = %.6fs\n",SUB84(local_140,0));
              lVar7 = local_58;
              lVar13 = local_60;
            }
            if ((local_140 == 9999.0) && (!NAN(local_140))) {
              local_140 = 0.0;
            }
            if ((local_130 == 9999.0) && (!NAN(local_130))) {
              local_130 = 0.0;
            }
            if (local_108 != (pointer)0x0) {
              operator_delete(local_108,(long)local_f8 - (long)local_108);
            }
            local_e8._0_8_ = &PTR_nbQubits_00122bc0;
            std::
            vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
            ::~vector((vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                       *)&local_d0);
            if (iStack_120._M_current == local_118) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_128,iStack_120,(int *)&local_144)
              ;
            }
            else {
              *iStack_120._M_current = local_144;
              iStack_120._M_current = iStack_120._M_current + 1;
            }
            if (iStack_90._M_current == local_88) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_98,iStack_90,&local_140);
            }
            else {
              *iStack_90._M_current = local_140;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
            if (iStack_b0._M_current == local_a8) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)&local_b8,iStack_b0,&local_130);
            }
            else {
              *iStack_b0._M_current = local_130;
              iStack_b0._M_current = iStack_b0._M_current + 1;
            }
            local_144 = local_144 + (int)lVar7;
            uVar11 = (ulong)local_144;
          } while ((int)local_144 <= (int)lVar13);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        if (iStack_120._M_current != local_128) {
          uVar11 = 0;
          do {
            dVar2 = *(double *)((long)local_98 + uVar11 * 8);
            dVar1 = *(double *)((long)local_b8 + uVar11 * 8);
            printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",SUB84(dVar2,0),dVar1,dVar2 / dVar1,
                   (ulong)(uint)local_128[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 2));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
      }
      if (local_b8 != (void *)0x0) {
        operator_delete(local_b8,(long)local_a8 - (long)local_b8);
      }
      if (local_98 != (void *)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if (local_128 != (int *)0x0) {
        operator_delete(local_128,(long)local_118 - (long)local_128);
      }
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,argv[5],(allocator<char> *)&local_78);
    uVar9 = local_e8._0_8_;
    piVar6 = __errno_location();
    iVar12 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol((char *)uVar9,(char **)&local_108,10);
    lVar13 = local_60;
    if (local_108 != (pointer)uVar9) {
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar12;
        }
        if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
        }
        bVar15 = ((uint)lVar7 & 0xfffffffd) == 1;
        goto LAB_00105913;
      }
      goto LAB_0010647c;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,argv[2],(allocator<char> *)&local_78);
    uVar9 = local_e8._0_8_;
    piVar6 = __errno_location();
    iVar12 = *piVar6;
    *piVar6 = 0;
    uVar11 = strtol((char *)uVar9,(char **)&local_108,10);
    if (local_108 == (pointer)uVar9) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < uVar11 - 0x80000000) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar12;
      }
      if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
      }
      goto LAB_001056ef;
    }
    std::__throw_out_of_range("stoi");
LAB_00106440:
    std::__throw_invalid_argument("stoi");
LAB_0010644c:
    std::__throw_out_of_range("stoi");
LAB_00106458:
    std::__throw_invalid_argument("stoi");
LAB_00106464:
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0010647c:
  uVar9 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar9);
}

Assistant:

int main( int argc , char *argv[] ) {

  // defaults
  char type = 'd' ;
  int  qmin = 10 ;
  int  qmax = 20 ;
  int  qstp = 2 ;
  int  test = 3 ;

  // arguments
  if ( argc > 1 ) type = argv[1][0] ;
  if ( argc > 2 ) qmin = std::stoi( argv[2] ) ;
  if ( argc > 3 ) qmax = std::stoi( argv[3] ) ;
  if ( argc > 4 ) qstp = std::stoi( argv[4] ) ;
  if ( argc > 5 ) test = std::stoi( argv[5] ) ;
  std::cout << "nb qubits = " << qmin << ":" << qstp << ":" << qmax ;

  int r = 0 ;
  if ( type == 's' ) {
    // float
    std::cout << ", T = std::complex<float>" << std::endl ;
    using T = std::complex< float > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else if ( type == 'd' ) {
    // double
    using T = std::complex< double > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    std::cout << ", T = std::complex<double>" << std::endl ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else {
    r = -100 ;
  }
  return r ;

}